

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O2

void lm_trie_alloc_ngram(lm_trie_t *trie,uint32 *counts,int order)

{
  void *base_mem;
  uint8 uVar1;
  uint uVar2;
  uint32 uVar3;
  size_t sVar5;
  uint8 *base_mem_00;
  middle_t *pmVar6;
  void *ptr;
  longest_t *plVar7;
  long lVar8;
  long lVar9;
  ulong uVar4;
  
  uVar2 = order - 1;
  uVar4 = (ulong)uVar2;
  sVar5 = 0;
  lVar9 = 1;
  while( true ) {
    trie->ngram_mem_size = sVar5;
    if ((int)uVar2 <= lVar9) break;
    uVar1 = lm_trie_quant_msize(trie->quant);
    uVar3 = middle_size(uVar1,counts[lVar9],*counts,counts[lVar9 + 1]);
    sVar5 = (ulong)uVar3 + trie->ngram_mem_size;
    lVar9 = lVar9 + 1;
  }
  uVar1 = lm_trie_quant_lsize(trie->quant);
  uVar3 = base_size(counts[(int)uVar2],*counts,uVar1);
  sVar5 = (ulong)uVar3 + trie->ngram_mem_size;
  trie->ngram_mem_size = sVar5;
  base_mem_00 = (uint8 *)__ckd_calloc__(sVar5,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                        ,0x1e2);
  trie->ngram_mem = base_mem_00;
  sVar5 = (size_t)(order + -2);
  pmVar6 = (middle_t *)
           __ckd_calloc__(sVar5,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x1e5);
  trie->middle_begin = pmVar6;
  trie->middle_end = pmVar6 + sVar5;
  ptr = __ckd_calloc__(sVar5,8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                       ,0x1e8);
  for (lVar9 = 2; lVar9 < order; lVar9 = lVar9 + 1) {
    *(uint8 **)((long)ptr + lVar9 * 8 + -0x10) = base_mem_00;
    uVar1 = lm_trie_quant_msize(trie->quant);
    uVar3 = middle_size(uVar1,counts[lVar9 + -1],*counts,counts[lVar9]);
    base_mem_00 = base_mem_00 + uVar3;
  }
  plVar7 = (longest_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x1ef);
  trie->longest = plVar7;
  lVar9 = 0;
  lVar8 = uVar4 * 0x30;
  while (1 < (int)(uVar2 + (int)lVar9)) {
    pmVar6 = trie->middle_begin;
    base_mem = *(void **)((long)ptr + lVar9 * 8 + uVar4 * 8 + -0x10);
    uVar1 = lm_trie_quant_msize(trie->quant);
    if (lVar9 == 0) {
      plVar7 = trie->longest;
    }
    else {
      plVar7 = (longest_t *)(&trie->middle_begin[-1].base.word_bits + lVar8);
    }
    middle_init((middle_t *)(&pmVar6[-2].base.word_bits + lVar8),base_mem,uVar1,
                counts[uVar4 + lVar9 + -1],*counts,counts[uVar4 + lVar9],plVar7);
    lVar9 = lVar9 + -1;
    lVar8 = lVar8 + -0x30;
  }
  ckd_free(ptr);
  plVar7 = trie->longest;
  uVar1 = lm_trie_quant_lsize(trie->quant);
  base_init(&plVar7->base,base_mem_00,*counts,uVar1);
  return;
}

Assistant:

static void
lm_trie_alloc_ngram(lm_trie_t * trie, uint32 * counts, int order)
{
    int i;
    uint8 *mem_ptr;
    uint8 **middle_starts;

    trie->ngram_mem_size = 0;
    for (i = 1; i < order - 1; i++) {
        trie->ngram_mem_size +=
            middle_size(lm_trie_quant_msize(trie->quant), counts[i],
                        counts[0], counts[i + 1]);
    }
    trie->ngram_mem_size +=
        longest_size(lm_trie_quant_lsize(trie->quant), counts[order - 1],
                     counts[0]);
    trie->ngram_mem =
        (uint8 *) ckd_calloc(trie->ngram_mem_size,
                             sizeof(*trie->ngram_mem));
    mem_ptr = trie->ngram_mem;
    trie->middle_begin =
        (middle_t *) ckd_calloc(order - 2, sizeof(*trie->middle_begin));
    trie->middle_end = trie->middle_begin + (order - 2);
    middle_starts =
        (uint8 **) ckd_calloc(order - 2, sizeof(*middle_starts));
    for (i = 2; i < order; i++) {
        middle_starts[i - 2] = mem_ptr;
        mem_ptr +=
            middle_size(lm_trie_quant_msize(trie->quant), counts[i - 1],
                        counts[0], counts[i]);
    }
    trie->longest = (longest_t *) ckd_calloc(1, sizeof(*trie->longest));
    /* Crazy backwards thing so we initialize using pointers to ones that have already been initialized */
    for (i = order - 1; i >= 2; --i) {
        middle_t *middle_ptr = &trie->middle_begin[i - 2];
        middle_init(middle_ptr, middle_starts[i - 2],
                    lm_trie_quant_msize(trie->quant), counts[i - 1],
                    counts[0], counts[i],
                    (i ==
                     order -
                     1) ? (void *) trie->longest : (void *) &trie->
                    middle_begin[i - 1]);
    }
    ckd_free(middle_starts);
    longest_init(trie->longest, mem_ptr, lm_trie_quant_lsize(trie->quant),
                 counts[0]);
}